

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManDeriveDivPair(int iDiv,Vec_Ptr_t *vDivs,int nWords,word *pRes)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (iDiv < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  uVar5 = (uint)iDiv >> 1 & 0x7fff;
  uVar3 = uVar5 >> 1;
  if ((vDivs->nSize <= (int)uVar3) || (vDivs->nSize <= (int)((uint)iDiv >> 0x11))) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar1 = vDivs->pArray[uVar3];
  pvVar2 = vDivs->pArray[(uint)iDiv >> 0x11];
  if (uVar5 < (uint)iDiv >> 0x10) {
    if ((iDiv & 1U) != 0) {
      __assert_fail("!fComp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                    ,0x375,"void Gia_ManDeriveDivPair(int, Vec_Ptr_t *, int, word *)");
    }
    if ((iDiv & 2U) == 0) {
      if (((uint)iDiv >> 0x10 & 1) == 0) {
        if (0 < nWords) {
          uVar4 = 0;
          do {
            pRes[uVar4] = *(ulong *)((long)pvVar2 + uVar4 * 8) &
                          *(ulong *)((long)pvVar1 + uVar4 * 8);
            uVar4 = uVar4 + 1;
          } while ((uint)nWords != uVar4);
        }
      }
      else if (0 < nWords) {
        uVar4 = 0;
        do {
          pRes[uVar4] = ~*(ulong *)((long)pvVar2 + uVar4 * 8) & *(ulong *)((long)pvVar1 + uVar4 * 8)
          ;
          uVar4 = uVar4 + 1;
        } while ((uint)nWords != uVar4);
      }
    }
    else if (((uint)iDiv >> 0x10 & 1) == 0) {
      if (0 < nWords) {
        uVar4 = 0;
        do {
          pRes[uVar4] = ~*(ulong *)((long)pvVar1 + uVar4 * 8) & *(ulong *)((long)pvVar2 + uVar4 * 8)
          ;
          uVar4 = uVar4 + 1;
        } while ((uint)nWords != uVar4);
      }
    }
    else if (0 < nWords) {
      uVar4 = 0;
      do {
        pRes[uVar4] = ~(*(ulong *)((long)pvVar2 + uVar4 * 8) | *(ulong *)((long)pvVar1 + uVar4 * 8))
        ;
        uVar4 = uVar4 + 1;
      } while ((uint)nWords != uVar4);
    }
  }
  else {
    if ((iDiv & 2U) != 0) {
      __assert_fail("!Abc_LitIsCompl(iDiv0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                    ,0x37a,"void Gia_ManDeriveDivPair(int, Vec_Ptr_t *, int, word *)");
    }
    if (((uint)iDiv >> 0x10 & 1) != 0) {
      __assert_fail("!Abc_LitIsCompl(iDiv1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                    ,0x37b,"void Gia_ManDeriveDivPair(int, Vec_Ptr_t *, int, word *)");
    }
    if (0 < nWords) {
      uVar4 = 0;
      do {
        pRes[uVar4] = *(ulong *)((long)pvVar2 + uVar4 * 8) ^ *(ulong *)((long)pvVar1 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while ((uint)nWords != uVar4);
    }
  }
  return;
}

Assistant:

void Gia_ManDeriveDivPair( int iDiv, Vec_Ptr_t * vDivs, int nWords, word * pRes )
{
    int fComp = Abc_LitIsCompl(iDiv);
    int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;
    int iDiv1 = Abc_Lit2Var(iDiv) >> 15;
    word * pDiv0 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv0));
    word * pDiv1 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv1));
    if ( iDiv0 < iDiv1 )
    {
        assert( !fComp );
        Abc_TtAndCompl( pRes, pDiv0, Abc_LitIsCompl(iDiv0), pDiv1, Abc_LitIsCompl(iDiv1), nWords );
    }
    else 
    {
        assert( !Abc_LitIsCompl(iDiv0) );
        assert( !Abc_LitIsCompl(iDiv1) );
        Abc_TtXor( pRes, pDiv0, pDiv1, nWords, 0 );
    }
}